

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_writer.cpp
# Opt level: O3

buffer_writer * __thiscall buffer_writer::operator<<(buffer_writer *this,uint64_t data)

{
  buffer_writer *pbVar1;
  
  operator<<(this,(uint8_t)data);
  operator<<(this,(uint8_t)(data >> 8));
  operator<<(this,(uint8_t)(data >> 0x10));
  operator<<(this,(uint8_t)(data >> 0x18));
  operator<<(this,(uint8_t)(data >> 0x20));
  operator<<(this,(uint8_t)(data >> 0x28));
  operator<<(this,(uint8_t)(data >> 0x30));
  pbVar1 = operator<<(this,(uint8_t)(data >> 0x38));
  return pbVar1;
}

Assistant:

buffer_writer& buffer_writer::operator<<(std::uint64_t data)
{
    *this << static_cast<std::uint8_t>(data)
          << static_cast<std::uint8_t>(data >> 8)
          << static_cast<std::uint8_t>(data >> 16)
          << static_cast<std::uint8_t>(data >> 24)
          << static_cast<std::uint8_t>(data >> 32)
          << static_cast<std::uint8_t>(data >> 40)
          << static_cast<std::uint8_t>(data >> 48)
          << static_cast<std::uint8_t>(data >> 56);

    return *this;
}